

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackArchiveGenerator.cxx
# Opt level: O0

int __thiscall cmCPackArchiveGenerator::PackageFiles(cmCPackArchiveGenerator *this)

{
  Compress c;
  cmCPackLog *pcVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  ostream *poVar5;
  char *pcVar6;
  reference pvVar7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  string local_df0 [32];
  string local_dd0;
  undefined1 local_db0 [8];
  ostringstream cmCPackLog_msg_5;
  string local_c38;
  undefined1 local_c18 [8];
  string rp;
  string *file;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  undefined1 local_bb8 [8];
  ostringstream cmCPackLog_msg_4;
  undefined1 local_a40 [8];
  cmWorkingDirectory workdir;
  string local_9f8;
  undefined1 local_9d8 [8];
  ostringstream cmCPackLog_msg_3;
  string local_860 [32];
  string local_840;
  undefined1 local_820 [8];
  ostringstream cmCPackLog_msg_2;
  undefined1 local_6a8 [8];
  cmArchiveWrite archive;
  string local_5c0 [32];
  undefined1 local_5a0 [8];
  ostringstream cmCPackLog_msg_1;
  undefined1 local_428 [8];
  cmGeneratedFileStream gf;
  ostringstream local_190 [8];
  ostringstream cmCPackLog_msg;
  cmCPackArchiveGenerator *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar5 = std::operator<<((ostream *)local_190,"Toplevel: ");
  poVar5 = std::operator<<(poVar5,(string *)&(this->super_cmCPackGenerator).toplevel);
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  pcVar1 = (this->super_cmCPackGenerator).Logger;
  std::__cxx11::ostringstream::str();
  pcVar6 = (char *)std::__cxx11::string::c_str();
  cmCPackLog::Log(pcVar1,4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                  ,0x12a,pcVar6);
  std::__cxx11::string::~string((string *)&gf.field_0x260);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  uVar3 = (*(this->super_cmCPackGenerator)._vptr_cmCPackGenerator[0x19])();
  if ((uVar3 & 1) == 0) {
    cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)local_428,None);
    pvVar7 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&(this->super_cmCPackGenerator).packageFileNames,0);
    cmGeneratedFileStream::Open((cmGeneratedFileStream *)local_428,pvVar7,false,true);
    iVar4 = (*(this->super_cmCPackGenerator)._vptr_cmCPackGenerator[0x1d])(this,local_428);
    if (iVar4 == 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5a0);
      poVar5 = std::operator<<((ostream *)local_5a0,"Problem to generate Header for archive <");
      pvVar7 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&(this->super_cmCPackGenerator).packageFileNames,0);
      poVar5 = std::operator<<(poVar5,(string *)pvVar7);
      poVar5 = std::operator<<(poVar5,">.");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      pcVar1 = (this->super_cmCPackGenerator).Logger;
      std::__cxx11::ostringstream::str();
      pcVar6 = (char *)std::__cxx11::string::c_str();
      cmCPackLog::Log(pcVar1,0x10,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                      ,0x13c,pcVar6);
      std::__cxx11::string::~string(local_5c0);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5a0);
      this_local._4_4_ = 0;
      archive.PermissionsMask.IsValueSet = true;
      archive.PermissionsMask._5_3_ = 0;
    }
    else {
      c = this->Compress;
      iVar4 = GetThreadCount(this);
      cmArchiveWrite::cmArchiveWrite
                ((cmArchiveWrite *)local_6a8,(ostream *)local_428,c,&this->ArchiveFormat,0,iVar4);
      bVar2 = cmArchiveWrite::Open((cmArchiveWrite *)local_6a8);
      if (bVar2) {
        bVar2 = cmArchiveWrite::operator!((cmArchiveWrite *)local_6a8);
        if (bVar2) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_9d8);
          poVar5 = std::operator<<((ostream *)local_9d8,"Problem to create archive <");
          pvVar7 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](&(this->super_cmCPackGenerator).packageFileNames,0);
          poVar5 = std::operator<<(poVar5,(string *)pvVar7);
          poVar5 = std::operator<<(poVar5,">, ERROR = ");
          cmArchiveWrite::GetError_abi_cxx11_(&local_9f8,(cmArchiveWrite *)local_6a8);
          poVar5 = std::operator<<(poVar5,(string *)&local_9f8);
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          std::__cxx11::string::~string((string *)&local_9f8);
          pcVar1 = (this->super_cmCPackGenerator).Logger;
          std::__cxx11::ostringstream::str();
          pcVar6 = (char *)std::__cxx11::string::c_str();
          cmCPackLog::Log(pcVar1,0x10,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                          ,0x13c,pcVar6);
          std::__cxx11::string::~string((string *)&workdir.ResultCode);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_9d8);
          this_local._4_4_ = 0;
          archive.PermissionsMask.IsValueSet = true;
          archive.PermissionsMask._5_3_ = 0;
        }
        else {
          cmWorkingDirectory::cmWorkingDirectory
                    ((cmWorkingDirectory *)local_a40,&(this->super_cmCPackGenerator).toplevel);
          bVar2 = cmWorkingDirectory::Failed((cmWorkingDirectory *)local_a40);
          if (bVar2) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_bb8);
            poVar5 = std::operator<<((ostream *)local_bb8,"Failed to change working directory to ");
            poVar5 = std::operator<<(poVar5,(string *)&(this->super_cmCPackGenerator).toplevel);
            poVar5 = std::operator<<(poVar5," : ");
            iVar4 = cmWorkingDirectory::GetLastResult((cmWorkingDirectory *)local_a40);
            pcVar6 = strerror(iVar4);
            poVar5 = std::operator<<(poVar5,pcVar6);
            std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
            pcVar1 = (this->super_cmCPackGenerator).Logger;
            std::__cxx11::ostringstream::str();
            pcVar6 = (char *)std::__cxx11::string::c_str();
            cmCPackLog::Log(pcVar1,0x10,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                            ,0x142,pcVar6);
            std::__cxx11::string::~string((string *)&__range1);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_bb8);
            this_local._4_4_ = 0;
            archive.PermissionsMask.IsValueSet = true;
            archive.PermissionsMask._5_3_ = 0;
          }
          else {
            this_00 = &(this->super_cmCPackGenerator).files;
            __end1 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::begin(this_00);
            file = (string *)
                   std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::end(this_00);
            while (bVar2 = __gnu_cxx::operator!=
                                     (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                               *)&file), bVar2) {
              rp.field_2._8_8_ =
                   __gnu_cxx::
                   __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&__end1);
              cmSystemTools::RelativePath
                        ((string *)local_c18,&(this->super_cmCPackGenerator).toplevel,
                         (string *)rp.field_2._8_8_);
              std::__cxx11::string::string((string *)&local_c38,(string *)local_c18);
              cmArchiveWrite::Add((cmArchiveWrite *)local_6a8,&local_c38,0,(char *)0x0,false);
              std::__cxx11::string::~string((string *)&local_c38);
              bVar2 = cmArchiveWrite::operator!((cmArchiveWrite *)local_6a8);
              if (bVar2) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_db0);
                poVar5 = std::operator<<((ostream *)local_db0,"Problem while adding file <");
                poVar5 = std::operator<<(poVar5,(string *)rp.field_2._8_8_);
                poVar5 = std::operator<<(poVar5,"> to archive <");
                pvVar7 = std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::operator[](&(this->super_cmCPackGenerator).packageFileNames,0);
                poVar5 = std::operator<<(poVar5,(string *)pvVar7);
                poVar5 = std::operator<<(poVar5,">, ERROR = ");
                cmArchiveWrite::GetError_abi_cxx11_(&local_dd0,(cmArchiveWrite *)local_6a8);
                poVar5 = std::operator<<(poVar5,(string *)&local_dd0);
                std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
                std::__cxx11::string::~string((string *)&local_dd0);
                pcVar1 = (this->super_cmCPackGenerator).Logger;
                std::__cxx11::ostringstream::str();
                pcVar6 = (char *)std::__cxx11::string::c_str();
                cmCPackLog::Log(pcVar1,0x10,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                                ,0x14d,pcVar6);
                std::__cxx11::string::~string(local_df0);
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_db0);
                this_local._4_4_ = 0;
              }
              archive.PermissionsMask._5_3_ = 0;
              archive.PermissionsMask.IsValueSet = bVar2;
              std::__cxx11::string::~string((string *)local_c18);
              if (archive.PermissionsMask._4_4_ != 0) goto LAB_001d3230;
              __gnu_cxx::
              __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator++(&__end1);
            }
            this_local._4_4_ = 1;
            archive.PermissionsMask.IsValueSet = true;
            archive.PermissionsMask._5_3_ = 0;
          }
LAB_001d3230:
          cmWorkingDirectory::~cmWorkingDirectory((cmWorkingDirectory *)local_a40);
        }
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_820);
        poVar5 = std::operator<<((ostream *)local_820,"Problem to open archive <");
        pvVar7 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](&(this->super_cmCPackGenerator).packageFileNames,0);
        poVar5 = std::operator<<(poVar5,(string *)pvVar7);
        poVar5 = std::operator<<(poVar5,">, ERROR = ");
        cmArchiveWrite::GetError_abi_cxx11_(&local_840,(cmArchiveWrite *)local_6a8);
        poVar5 = std::operator<<(poVar5,(string *)&local_840);
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string((string *)&local_840);
        pcVar1 = (this->super_cmCPackGenerator).Logger;
        std::__cxx11::ostringstream::str();
        pcVar6 = (char *)std::__cxx11::string::c_str();
        cmCPackLog::Log(pcVar1,0x10,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                        ,0x13c,pcVar6);
        std::__cxx11::string::~string(local_860);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_820);
        this_local._4_4_ = 0;
        archive.PermissionsMask.IsValueSet = true;
        archive.PermissionsMask._5_3_ = 0;
      }
      cmArchiveWrite::~cmArchiveWrite((cmArchiveWrite *)local_6a8);
    }
    cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_428);
  }
  else if ((this->super_cmCPackGenerator).componentPackageMethod == ONE_PACKAGE) {
    this_local._4_4_ = PackageComponentsAllInOne(this);
  }
  else {
    this_local._4_4_ =
         PackageComponents(this,(this->super_cmCPackGenerator).componentPackageMethod ==
                                ONE_PACKAGE_PER_COMPONENT);
  }
  return this_local._4_4_;
}

Assistant:

int cmCPackArchiveGenerator::PackageFiles()
{
  cmCPackLogger(cmCPackLog::LOG_DEBUG,
                "Toplevel: " << this->toplevel << std::endl);

  if (this->WantsComponentInstallation()) {
    // CASE 1 : COMPONENT ALL-IN-ONE package
    // If ALL COMPONENTS in ONE package has been requested
    // then the package file is unique and should be open here.
    if (this->componentPackageMethod == ONE_PACKAGE) {
      return this->PackageComponentsAllInOne();
    }
    // CASE 2 : COMPONENT CLASSICAL package(s) (i.e. not all-in-one)
    // There will be 1 package for each component group
    // however one may require to ignore component group and
    // in this case you'll get 1 package for each component.
    return this->PackageComponents(this->componentPackageMethod ==
                                   ONE_PACKAGE_PER_COMPONENT);
  }

  // CASE 3 : NON COMPONENT package.
  DECLARE_AND_OPEN_ARCHIVE(packageFileNames[0], archive);
  cmWorkingDirectory workdir(this->toplevel);
  if (workdir.Failed()) {
    cmCPackLogger(cmCPackLog::LOG_ERROR,
                  "Failed to change working directory to "
                    << this->toplevel << " : "
                    << std::strerror(workdir.GetLastResult()) << std::endl);
    return 0;
  }
  for (std::string const& file : this->files) {
    // Get the relative path to the file
    std::string rp = cmSystemTools::RelativePath(this->toplevel, file);
    archive.Add(rp, 0, nullptr, false);
    if (!archive) {
      cmCPackLogger(cmCPackLog::LOG_ERROR,
                    "Problem while adding file <"
                      << file << "> to archive <" << this->packageFileNames[0]
                      << ">, ERROR = " << archive.GetError() << std::endl);
      return 0;
    }
  }
  // The destructor of cmArchiveWrite will close and finish the write
  return 1;
}